

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O2

int __thiscall uWS::Loop::init(Loop *this,EVP_PKEY_CTX *ctx)

{
  LoopData *this_00;
  
  this_00 = (LoopData *)us_loop_ext();
  LoopData::LoopData(this_00);
  return (int)this;
}

Assistant:

Loop *init() {
        new (us_loop_ext((us_loop_t *) this)) LoopData;
        return this;
    }